

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

json * __thiscall inja::Renderer::get_imm_abi_cxx11_(Renderer *this,Bytecode *bc)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  string_view sVar1;
  const_pointer pcVar2;
  uint *out;
  string_view dot;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  arguments;
  CallbackFunction callback;
  exception *anon_var_0;
  string local_d0;
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  const_pointer local_98;
  size_type local_90;
  inja *local_78;
  const_pointer local_70;
  string_view local_68;
  undefined4 local_54;
  undefined1 local_50 [8];
  string_view ptr;
  string ptr_buffer;
  Bytecode *bc_local;
  Renderer *this_local;
  
  std::__cxx11::string::string((string *)&ptr.size_);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  sVar1.size_ = (size_type)ptr.data_;
  sVar1.data_ = (const_pointer)local_50;
  out = &switchD_001e71b1::switchdataD_004c8960;
  switch(*(uint *)&bc->field_0x4 >> 0x1e) {
  case 0:
    this_local = (Renderer *)0x0;
    goto LAB_001e767b;
  case 1:
    this_local = (Renderer *)&bc->value;
    goto LAB_001e767b;
  case 2:
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,std::char_traits<char>> *)&local_78,&bc->str);
    dot.size_ = (size_type)&ptr.size_;
    dot.data_ = local_70;
    local_68 = convert_dot_to_json_pointer(local_78,dot,(string *)out);
    sVar1 = local_68;
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&ptr.size_,'/');
    std::__cxx11::string::operator+=((string *)&ptr.size_,(string *)&bc->str);
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,std::char_traits<char>> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr.size_);
    sVar1.size_ = local_90;
    sVar1.data_ = local_98;
  }
  ptr.data_ = (const_pointer)sVar1.size_;
  local_50 = (undefined1  [8])sVar1.data_;
  this_00 = this->m_data;
  pcVar2 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,pcVar2,(allocator *)((long)&anon_var_0 + 7));
  nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_pointer(&local_b0,&local_d0);
  this_local = (Renderer *)
               nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(this_00,&local_b0);
  nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~json_pointer(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
LAB_001e767b:
  local_54 = 1;
  std::__cxx11::string::~string((string *)&ptr.size_);
  return (json *)this_local;
}

Assistant:

const json* get_imm(const Bytecode& bc) {
		std::string ptr_buffer;
		nonstd::string_view ptr;
		switch (bc.flags & Bytecode::Flag::ValueMask) {
			case Bytecode::Flag::ValuePop:
				return nullptr;
			case Bytecode::Flag::ValueImmediate:
				return &bc.value;
			case Bytecode::Flag::ValueLookupDot:
				ptr = convert_dot_to_json_pointer(bc.str, ptr_buffer);
				break;
			case Bytecode::Flag::ValueLookupPointer:
				ptr_buffer += '/';
				ptr_buffer += bc.str;
				ptr = ptr_buffer;
				break;
		}
		try {
			return &m_data->at(json::json_pointer(ptr.data()));
		} catch (std::exception&) {
			// try to evaluate as a no-argument callback
			if (auto callback = m_callbacks.find_callback(bc.str, 0)) {
				std::vector<const json*> arguments{};
				m_tmp_val = callback(arguments);
				return &m_tmp_val;
			}
			inja_throw("render_error", "variable '" + static_cast<std::string>(bc.str) + "' not found");
			return nullptr;
		}
	}